

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O0

float quad_decode(apriltag_detector_t *td,apriltag_family_t *family,image_u8_t *im,quad *quad,
                 quick_decode_entry *entry,image_u8_t *im_samples)

{
  int iVar1;
  int iVar2;
  matd_t *H;
  long lVar3;
  double *values;
  uint64_t rcode_00;
  double dVar4;
  double dVar5;
  double dVar6;
  double dStack_2f0;
  double adStack_2e8 [2];
  double *local_2d8;
  double local_2d0;
  double local_2c8;
  double v_2;
  uint32_t local_2b8;
  int bitx_1;
  int bity_1;
  int i_2;
  uint64_t rcode;
  int iy_1;
  int ix_1;
  double thresh;
  double v_1;
  double py_1;
  double px_1;
  double tagy_1;
  double tagx_1;
  double tagy01_1;
  double tagx01_1;
  int bitx;
  int bity;
  int i_1;
  int min_coord;
  unsigned_long __vla_expr0;
  float local_23c;
  float local_238;
  float white_score_count;
  float black_score_count;
  float white_score;
  float black_score;
  int v;
  int iy;
  int ix;
  double py;
  double px;
  double tagy;
  double tagx;
  double tagy01;
  double tagx01;
  int i;
  int is_white;
  float *pattern;
  undefined1 local_1d8 [4];
  int pattern_idx;
  graymodel blackmodel;
  graymodel whitemodel;
  float patterns [40];
  image_u8_t *im_samples_local;
  quick_decode_entry *entry_local;
  quad *quad_local;
  image_u8_t *im_local;
  apriltag_family_t *family_local;
  apriltag_detector_t *td_local;
  
  patterns[0] = 0.0;
  patterns[1] = 1.0;
  patterns[2] = 1.0;
  patterns[3] = 0.5;
  patterns[4] = 0.5;
  patterns[5] = 0.0;
  patterns[6] = 1.0;
  patterns[7] = 0.0;
  patterns[8] = (float)family->width_at_border + 0.5;
  patterns[9] = 0.5;
  patterns[10] = 0.0;
  patterns[0xb] = 1.0;
  patterns[0xc] = 1.0;
  patterns[0xd] = (float)family->width_at_border - 0.5;
  patterns[0xe] = 0.5;
  patterns[0xf] = 0.0;
  patterns[0x10] = 1.0;
  patterns[0x11] = 0.0;
  patterns[0x12] = 0.5;
  patterns[0x13] = -0.5;
  patterns[0x14] = 1.0;
  patterns[0x15] = 0.0;
  patterns[0x16] = 1.0;
  patterns[0x17] = 0.5;
  patterns[0x18] = 0.5;
  patterns[0x19] = 1.0;
  patterns[0x1a] = 0.0;
  patterns[0x1b] = 0.0;
  patterns[0x1c] = 0.5;
  patterns[0x1d] = (float)family->width_at_border + 0.5;
  patterns[0x1e] = 1.0;
  patterns[0x1f] = 0.0;
  patterns[0x20] = 1.0;
  patterns[0x21] = 0.5;
  patterns[0x22] = (float)family->width_at_border - 0.5;
  patterns[0x23] = 1.0;
  patterns[0x24] = 0.0;
  patterns[0x25] = 0.0;
  dStack_2f0 = 5.38424341721811e-318;
  graymodel_init((graymodel *)(blackmodel.C + 2));
  dStack_2f0 = 5.38430270509561e-318;
  graymodel_init((graymodel *)local_1d8);
  for (pattern._4_4_ = 0; pattern._4_4_ < 8; pattern._4_4_ = pattern._4_4_ + 1) {
    _i = patterns + (long)(int)(pattern._4_4_ * 5) + -2;
    tagx01._4_4_ = (int)patterns[(long)(int)(pattern._4_4_ * 5) + 2];
    for (tagx01._0_4_ = 0; tagx01._0_4_ < family->width_at_border; tagx01._0_4_ = tagx01._0_4_ + 1)
    {
      tagy01 = (double)(((float)tagx01._0_4_ * _i[2] + *_i) / (float)family->width_at_border);
      tagx = (double)(((float)tagx01._0_4_ * _i[3] + _i[1]) / (float)family->width_at_border);
      tagy = (tagy01 - 0.5) * 2.0;
      px = (tagx - 0.5) * 2.0;
      dStack_2f0 = 5.38606651945127e-318;
      homography_project(quad->H,tagy,px,&py,(double *)&iy);
      v = (int)py;
      black_score = (float)(int)_iy;
      if ((((-1 < v) && (-1 < (int)black_score)) && (v < im->width)) &&
         ((int)black_score < im->height)) {
        white_score = (float)(uint)im->buf[(int)black_score * im->stride + v];
        if (im_samples != (image_u8_t *)0x0) {
          im_samples->buf[(int)black_score * im_samples->stride + v] =
               -('\x01' - (char)tagx01._4_4_);
        }
        if (tagx01._4_4_ == 0) {
          dStack_2f0 = 5.38737085275629e-318;
          graymodel_add((graymodel *)local_1d8,tagy,px,(double)(int)white_score);
        }
        else {
          dStack_2f0 = 5.38718310781087e-318;
          graymodel_add((graymodel *)(blackmodel.C + 2),tagy,px,(double)(int)white_score);
        }
      }
    }
  }
  dStack_2f0 = 5.38764752951796e-318;
  graymodel_solve((graymodel *)(blackmodel.C + 2));
  dStack_2f0 = 5.38770681739546e-318;
  graymodel_solve((graymodel *)local_1d8);
  dStack_2f0 = 5.38779574921171e-318;
  local_2d0 = graymodel_interpolate((graymodel *)(blackmodel.C + 2),0.0,0.0);
  dStack_2f0 = 5.38792420627963e-318;
  dVar4 = graymodel_interpolate((graymodel *)local_1d8,0.0,0.0);
  if (local_2d0 - dVar4 < 0.0 == (bool)(family->reversed_border & 1U)) {
    black_score_count = 0.0;
    white_score_count = 0.0;
    local_238 = 1.0;
    local_23c = 1.0;
    _i_1 = (ulong)(uint)(family->total_width * family->total_width);
    lVar3 = -(_i_1 * 8 + 0xf & 0xfffffffffffffff0);
    iVar1 = family->total_width;
    iVar2 = family->total_width;
    local_2d8 = (double *)((long)adStack_2e8 + lVar3);
    __vla_expr0 = (unsigned_long)adStack_2e8;
    *(undefined8 *)((long)&dStack_2f0 + lVar3) = 0x10a49a;
    memset((double *)((long)adStack_2e8 + lVar3),0,(long)(iVar1 * iVar2) << 3);
    bity = (family->width_at_border - family->total_width) / 2;
    for (bitx = 0; values = local_2d8, (uint)bitx < family->nbits; bitx = bitx + 1) {
      tagx01_1._4_4_ = family->bit_y[bitx];
      tagx01_1._0_4_ = family->bit_x[bitx];
      tagy01_1 = ((double)(int)tagx01_1._0_4_ + 0.5) / (double)family->width_at_border;
      tagx_1 = ((double)(int)tagx01_1._4_4_ + 0.5) / (double)family->width_at_border;
      dVar4 = (tagy01_1 - 0.5) * 2.0;
      dVar5 = (tagx_1 - 0.5) * 2.0;
      H = quad->H;
      px_1 = dVar5;
      tagy_1 = dVar4;
      *(undefined8 *)((long)&dStack_2f0 + lVar3) = 0x10a5d0;
      homography_project(H,dVar4,dVar5,&py_1,&v_1);
      dVar5 = py_1;
      dVar4 = v_1;
      *(undefined8 *)((long)&dStack_2f0 + lVar3) = 0x10a5e9;
      thresh = value_for_pixel(im,dVar5,dVar4);
      dVar5 = tagy_1;
      dVar4 = px_1;
      if ((thresh != -1.0) || (NAN(thresh))) {
        *(undefined8 *)((long)&dStack_2f0 + lVar3) = 0x10a62a;
        adStack_2e8[1] = graymodel_interpolate((graymodel *)local_1d8,dVar5,dVar4);
        dVar5 = tagy_1;
        dVar4 = px_1;
        *(undefined8 *)((long)&dStack_2f0 + lVar3) = 0x10a64e;
        dVar4 = graymodel_interpolate((graymodel *)(blackmodel.C + 2),dVar5,dVar4);
        _iy_1 = (adStack_2e8[1] + dVar4) / 2.0;
        local_2d8[(int)((family->total_width * (tagx01_1._4_4_ - bity) + tagx01_1._0_4_) - bity)] =
             thresh - _iy_1;
        if (im_samples != (image_u8_t *)0x0) {
          rcode._4_4_ = (int)py_1;
          rcode._0_4_ = (int)v_1;
          im_samples->buf[(int)rcode * im_samples->stride + rcode._4_4_] = -(thresh < _iy_1);
        }
      }
    }
    iVar1 = family->total_width;
    *(undefined8 *)((long)&dStack_2f0 + lVar3) = 0x10a748;
    sharpen(td,values,iVar1);
    _bity_1 = 0;
    for (bitx_1 = 0; rcode_00 = _bity_1, (uint)bitx_1 < family->nbits; bitx_1 = bitx_1 + 1) {
      local_2b8 = family->bit_y[bitx_1];
      v_2._4_4_ = family->bit_x[bitx_1];
      _bity_1 = _bity_1 << 1;
      local_2c8 = local_2d8[(int)(((local_2b8 - bity) * family->total_width + v_2._4_4_) - bity)];
      if (local_2c8 <= 0.0) {
        black_score_count = (float)((double)black_score_count - local_2c8);
        local_238 = local_238 + 1.0;
      }
      else {
        white_score_count = (float)((double)white_score_count + local_2c8);
        local_23c = local_23c + 1.0;
        _bity_1 = _bity_1 | 1;
      }
    }
    *(undefined8 *)((long)&dStack_2f0 + lVar3) = 0x10a8af;
    quick_decode_codeword(family,rcode_00,entry);
    dVar6 = (double)(white_score_count / local_23c);
    dVar4 = (double)(black_score_count / local_238);
    dVar5 = dVar4;
    if (dVar6 <= dVar4) {
      dVar5 = dVar6;
    }
    td_local._4_4_ =
         (float)(double)(~-(ulong)NAN(dVar6) & (ulong)dVar5 | -(ulong)NAN(dVar6) & (ulong)dVar4);
  }
  else {
    td_local._4_4_ = -1.0;
  }
  return td_local._4_4_;
}

Assistant:

float quad_decode(apriltag_detector_t* td, apriltag_family_t *family, image_u8_t *im, struct quad *quad, struct quick_decode_entry *entry, image_u8_t *im_samples)
{
    // decode the tag binary contents by sampling the pixel
    // closest to the center of each bit cell.

    // We will compute a threshold by sampling known white/black cells around this tag.
    // This sampling is achieved by considering a set of samples along lines.
    //
    // coordinates are given in bit coordinates. ([0, fam->border_width]).
    //
    // { initial x, initial y, delta x, delta y, WHITE=1 }
    float patterns[] = {
        // left white column
        -0.5, 0.5,
        0, 1,
        1,

        // left black column
        0.5, 0.5,
        0, 1,
        0,

        // right white column
        family->width_at_border + 0.5, .5,
        0, 1,
        1,

        // right black column
        family->width_at_border - 0.5, .5,
        0, 1,
        0,

        // top white row
        0.5, -0.5,
        1, 0,
        1,

        // top black row
        0.5, 0.5,
        1, 0,
        0,

        // bottom white row
        0.5, family->width_at_border + 0.5,
        1, 0,
        1,

        // bottom black row
        0.5, family->width_at_border - 0.5,
        1, 0,
        0

        // XXX double-counts the corners.
    };

    struct graymodel whitemodel, blackmodel;
    graymodel_init(&whitemodel);
    graymodel_init(&blackmodel);

    for (int pattern_idx = 0; pattern_idx < sizeof(patterns)/(5*sizeof(float)); pattern_idx ++) {
        float *pattern = &patterns[pattern_idx * 5];

        int is_white = pattern[4];

        for (int i = 0; i < family->width_at_border; i++) {
            double tagx01 = (pattern[0] + i*pattern[2]) / (family->width_at_border);
            double tagy01 = (pattern[1] + i*pattern[3]) / (family->width_at_border);

            double tagx = 2*(tagx01-0.5);
            double tagy = 2*(tagy01-0.5);

            double px, py;
            homography_project(quad->H, tagx, tagy, &px, &py);

            // don't round
            int ix = px;
            int iy = py;
            if (ix < 0 || iy < 0 || ix >= im->width || iy >= im->height)
                continue;

            int v = im->buf[iy*im->stride + ix];

            if (im_samples) {
                im_samples->buf[iy*im_samples->stride + ix] = (1-is_white)*255;
            }

            if (is_white)
                graymodel_add(&whitemodel, tagx, tagy, v);
            else
                graymodel_add(&blackmodel, tagx, tagy, v);
        }
    }

    graymodel_solve(&whitemodel);
    graymodel_solve(&blackmodel);

    // XXX Tunable
    if ((graymodel_interpolate(&whitemodel, 0, 0) - graymodel_interpolate(&blackmodel, 0, 0) < 0) != family->reversed_border) {
        return -1;
    }

    // compute the average decision margin (how far was each bit from
    // the decision boundary?
    //
    // we score this separately for white and black pixels and return
    // the minimum average threshold for black/white pixels. This is
    // to penalize thresholds that are too close to an extreme.
    float black_score = 0, white_score = 0;
    float black_score_count = 1, white_score_count = 1;

    double values[family->total_width*family->total_width];
    memset(values, 0, family->total_width*family->total_width*sizeof(double));

    int min_coord = (family->width_at_border - family->total_width)/2;
    for (int i = 0; i < family->nbits; i++) {
        int bity = family->bit_y[i];
        int bitx = family->bit_x[i];

        double tagx01 = (bitx + 0.5) / (family->width_at_border);
        double tagy01 = (bity + 0.5) / (family->width_at_border);

        // scale to [-1, 1]
        double tagx = 2*(tagx01-0.5);
        double tagy = 2*(tagy01-0.5);

        double px, py;
        homography_project(quad->H, tagx, tagy, &px, &py);

        double v = value_for_pixel(im, px, py);

        if (v == -1) {
            continue;
        }

        double thresh = (graymodel_interpolate(&blackmodel, tagx, tagy) + graymodel_interpolate(&whitemodel, tagx, tagy)) / 2.0;
        values[family->total_width*(bity - min_coord) + bitx - min_coord] = v - thresh;

        if (im_samples) {
            int ix = px;
            int iy = py;
            im_samples->buf[iy*im_samples->stride + ix] = (v < thresh) * 255;
        }
    }

    sharpen(td, values, family->total_width);

    uint64_t rcode = 0;
    for (int i = 0; i < family->nbits; i++) {
        int bity = family->bit_y[i];
        int bitx = family->bit_x[i];
        rcode = (rcode << 1);
        double v = values[(bity - min_coord)*family->total_width + bitx - min_coord];

        if (v > 0) {
            white_score += v;
            white_score_count++;
            rcode |= 1;
        } else {
            black_score -= v;
            black_score_count++;
        }
    }

    quick_decode_codeword(family, rcode, entry);
    return fmin(white_score / white_score_count, black_score / black_score_count);
}